

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Statement> __thiscall Parser::expressionStatement(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<Expression> expr;
  undefined1 local_31;
  _Alloc_hider local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  expression((Parser *)&stack0xffffffffffffffe0);
  consume(in_RSI,StatEnd,"\';\'");
  local_30._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ExpressionStatement,std::allocator<ExpressionStatement>,std::shared_ptr<Expression>&>
            (&local_28,(ExpressionStatement **)&local_30,(allocator<ExpressionStatement> *)&local_31
             ,(shared_ptr<Expression> *)&stack0xffffffffffffffe0);
  _Var1._M_pi = local_28._M_pi;
  (this->filepath)._M_dataplus._M_p = local_30._M_p;
  (this->filepath)._M_string_length = 0;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_string_length = (size_type)_Var1._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::expressionStatement() {
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<ExpressionStatement>(expr);
}